

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

char * tf::to_string(TaskType type)

{
  char *val;
  TaskType type_local;
  
  switch(type) {
  case PLACEHOLDER:
    val = "placeholder";
    break;
  case STATIC:
    val = "static";
    break;
  case RUNTIME:
    val = "runtime";
    break;
  case SUBFLOW:
    val = "subflow";
    break;
  case CONDITION:
    val = "condition";
    break;
  case MODULE:
    val = "module";
    break;
  case ASYNC:
    val = "async";
    break;
  default:
    val = "undefined";
  }
  return val;
}

Assistant:

inline const char* to_string(TaskType type) {

  const char* val;

  switch(type) {
    case TaskType::PLACEHOLDER:      val = "placeholder";     break;
    case TaskType::STATIC:           val = "static";          break;
    case TaskType::RUNTIME:          val = "runtime";         break;
    case TaskType::SUBFLOW:          val = "subflow";         break;
    case TaskType::CONDITION:        val = "condition";       break;
    case TaskType::MODULE:           val = "module";          break;
    case TaskType::ASYNC:            val = "async";           break;
    default:                         val = "undefined";       break;
  }

  return val;
}